

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_448486::HandleTransformPathCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status,
               function<cmCMakePath_(const_cmCMakePath_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *transform,bool normalizeOption)

{
  _List *path_00;
  bool bVar1;
  ArgumentParserWithOutputVariable<Arguments> *pAVar2;
  cmMakefile *pcVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  const_reference pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  string *psVar6;
  static_string_view sVar7;
  string *local_3f8;
  string local_388;
  string_view local_368;
  cmCMakePath local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  cmCMakePath local_310;
  undefined1 local_2e8 [8];
  cmCMakePath path;
  string inputPath;
  string baseDirectory;
  cmAlphaNum local_250;
  string local_220;
  undefined4 local_1fc;
  undefined1 local_1f8 [8];
  Arguments arguments;
  ArgumentParserWithOutputVariable<Arguments> local_140;
  undefined1 local_b8 [8];
  ArgumentParserWithOutputVariable<Arguments> parser;
  bool normalizeOption_local;
  function<cmCMakePath_(const_cmCMakePath_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *transform_local;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  parser.super_CMakePathArgumentParser<Arguments>.Inputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = normalizeOption;
  ArgumentParserWithOutputVariable<Arguments>::ArgumentParserWithOutputVariable(&local_140);
  sVar7 = ::cm::operator____s("BASE_DIRECTORY",0xe);
  pAVar2 = (anonymous_namespace)::
           ArgumentParserWithOutputVariable<(anonymous_namespace)::HandleTransformPathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&,std::function<cmCMakePath(cmCMakePath_const&,std::__cxx11::string_const&)>const&,bool)::Arguments>
           ::Bind<std::optional<std::__cxx11::string>>
                     ((ArgumentParserWithOutputVariable<(anonymous_namespace)::HandleTransformPathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&,std::function<cmCMakePath(cmCMakePath_const&,std::__cxx11::string_const&)>const&,bool)::Arguments>
                       *)&local_140,sVar7,0x58);
  ArgumentParserWithOutputVariable<Arguments>::ArgumentParserWithOutputVariable
            ((ArgumentParserWithOutputVariable<Arguments> *)local_b8,pAVar2);
  ArgumentParserWithOutputVariable<Arguments>::~ArgumentParserWithOutputVariable(&local_140);
  if ((parser.super_CMakePathArgumentParser<Arguments>.Inputs.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    sVar7 = ::cm::operator____s("NORMALIZE",9);
    arguments._128_8_ = sVar7.super_string_view._M_len;
    ArgumentParserWithOutputVariable<Arguments>::Bind<bool>
              ((ArgumentParserWithOutputVariable<Arguments> *)local_b8,sVar7,0x80);
  }
  ArgumentParserWithOutputVariable<Arguments>::Parse<2>
            ((Arguments *)local_1f8,(ArgumentParserWithOutputVariable<Arguments> *)local_b8,args);
  pcVar3 = cmExecutionStatus::GetMakefile(status);
  bVar1 = ArgumentParser::ParseResult::MaybeReportError((ParseResult *)local_1f8,pcVar3);
  if (bVar1) {
    args_local._7_1_ = true;
    local_1fc = 1;
  }
  else {
    this = (anonymous_namespace)::
           CMakePathArgumentParser<(anonymous_namespace)::HandleTransformPathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&,std::function<cmCMakePath(cmCMakePath_const&,std::__cxx11::string_const&)>const&,bool)::Arguments>
           ::GetInputs_abi_cxx11_
                     ((CMakePathArgumentParser<(anonymous_namespace)::HandleTransformPathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&,std::function<cmCMakePath(cmCMakePath_const&,std::__cxx11::string_const&)>const&,bool)::Arguments>
                       *)local_b8);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(this);
    if (bVar1) {
      std::__cxx11::string::string((string *)(inputPath.field_2._M_local_buf + 8));
      bVar1 = std::optional::operator_cast_to_bool
                        ((optional *)
                         &arguments.Output.
                          super__Optional_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_engaged);
      if (bVar1) {
        pbVar5 = std::
                 optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&arguments.Output.
                                 super__Optional_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                                 ._M_payload.
                                 super__Optional_payload<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_engaged);
        std::__cxx11::string::operator=
                  ((string *)(inputPath.field_2._M_local_buf + 8),(string *)pbVar5);
      }
      else {
        pcVar3 = cmExecutionStatus::GetMakefile(status);
        psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar3);
        std::__cxx11::string::operator=
                  ((string *)(inputPath.field_2._M_local_buf + 8),(string *)psVar6);
      }
      path_00 = &path.Path._M_cmpts;
      std::__cxx11::string::string((string *)path_00);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,1);
      bVar1 = getInputPath(pvVar4,status,(string *)path_00);
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_330,(string *)&path.Path._M_cmpts);
        cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                  (&local_310,&local_330,generic_format);
        std::
        function<cmCMakePath_(const_cmCMakePath_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator()((cmCMakePath *)local_2e8,transform,&local_310,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&inputPath.field_2 + 8));
        cmCMakePath::~cmCMakePath(&local_310);
        std::__cxx11::string::~string((string *)&local_330);
        if ((arguments.BaseDirectory.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_engaged & 1U) != 0) {
          cmCMakePath::Normal(&local_358,(cmCMakePath *)local_2e8);
          cmCMakePath::operator=((cmCMakePath *)local_2e8,&local_358);
          cmCMakePath::~cmCMakePath(&local_358);
        }
        pcVar3 = cmExecutionStatus::GetMakefile(status);
        bVar1 = std::optional::operator_cast_to_bool
                          ((optional *)
                           &arguments.super_ParseResult.KeywordErrors._M_t._M_impl.
                            super__Rb_tree_header._M_node_count);
        if (bVar1) {
          local_3f8 = &std::
                       optional<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator*((optional<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&arguments.super_ParseResult.KeywordErrors._M_t._M_impl.
                                       super__Rb_tree_header._M_node_count)->
                       super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>;
        }
        else {
          local_3f8 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[](args,1);
        }
        cmCMakePath::String_abi_cxx11_(&local_388,(cmCMakePath *)local_2e8);
        local_368 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_388);
        cmMakefile::AddDefinition(pcVar3,local_3f8,local_368);
        std::__cxx11::string::~string((string *)&local_388);
        args_local._7_1_ = true;
        local_1fc = 1;
        cmCMakePath::~cmCMakePath((cmCMakePath *)local_2e8);
      }
      else {
        args_local._7_1_ = false;
        local_1fc = 1;
      }
      std::__cxx11::string::~string((string *)&path.Path._M_cmpts);
      std::__cxx11::string::~string((string *)(inputPath.field_2._M_local_buf + 8));
    }
    else {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,0);
      cmAlphaNum::cmAlphaNum(&local_250,pvVar4);
      cmAlphaNum::cmAlphaNum
                ((cmAlphaNum *)((long)&baseDirectory.field_2 + 8),
                 " called with unexpected arguments.");
      cmStrCat<>(&local_220,&local_250,(cmAlphaNum *)((long)&baseDirectory.field_2 + 8));
      cmExecutionStatus::SetError(status,&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      args_local._7_1_ = false;
      local_1fc = 1;
    }
  }
  HandleTransformPathCommand::Arguments::~Arguments((Arguments *)local_1f8);
  ArgumentParserWithOutputVariable<Arguments>::~ArgumentParserWithOutputVariable
            ((ArgumentParserWithOutputVariable<Arguments> *)local_b8);
  return args_local._7_1_;
}

Assistant:

bool HandleTransformPathCommand(
  std::vector<std::string> const& args, cmExecutionStatus& status,
  const std::function<cmCMakePath(const cmCMakePath&,
                                  const std::string& base)>& transform,
  bool normalizeOption = false)
{
  struct Arguments : public ArgumentParser::ParseResult
  {
    cm::optional<ArgumentParser::NonEmpty<std::string>> Output;
    cm::optional<std::string> BaseDirectory;
    bool Normalize = false;
  };

  auto parser = ArgumentParserWithOutputVariable<Arguments>{}.Bind(
    "BASE_DIRECTORY"_s, &Arguments::BaseDirectory);
  if (normalizeOption) {
    parser.Bind("NORMALIZE"_s, &Arguments::Normalize);
  }

  Arguments arguments = parser.Parse(args);

  if (arguments.MaybeReportError(status.GetMakefile())) {
    return true;
  }

  if (!parser.GetInputs().empty()) {
    status.SetError(cmStrCat(args[0], " called with unexpected arguments."));
    return false;
  }

  std::string baseDirectory;
  if (arguments.BaseDirectory) {
    baseDirectory = *arguments.BaseDirectory;
  } else {
    baseDirectory = status.GetMakefile().GetCurrentSourceDirectory();
  }

  std::string inputPath;
  if (!getInputPath(args[1], status, inputPath)) {
    return false;
  }

  auto path = transform(cmCMakePath(inputPath), baseDirectory);
  if (arguments.Normalize) {
    path = path.Normal();
  }

  status.GetMakefile().AddDefinition(
    arguments.Output ? *arguments.Output : args[1], path.String());

  return true;
}